

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O3

void __thiscall
google::protobuf::anon_unknown_0::
MessageDifferencerTest_TreatRepeatedFieldAsSetWithIgnoredFields_Test::TestBody
          (MessageDifferencerTest_TreatRepeatedFieldAsSetWithIgnoredFields_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  FieldDescriptor *field;
  tuple<google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_std::default_delete<google::protobuf::util::MessageDifferencer::IgnoreCriteria>_>
  this_00;
  Message *in_RCX;
  char *in_R9;
  string_view input;
  string_view input_00;
  TestDiffMessage msg1;
  TestDiffMessage msg2;
  MessageDifferencer differ;
  __uniq_ptr_impl<google::protobuf::util::MessageDifferencer::IgnoreCriteria,_std::default_delete<google::protobuf::util::MessageDifferencer::IgnoreCriteria>_>
  local_380;
  AssertHelper local_378;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_370;
  string local_368;
  internal local_348 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_340;
  TestDiffMessage local_338;
  TestDiffMessage local_280;
  MessageDifferencer local_1c8;
  
  proto2_unittest::TestDiffMessage::TestDiffMessage(&local_338,(Arena *)0x0);
  proto2_unittest::TestDiffMessage::TestDiffMessage(&local_280,(Arena *)0x0);
  input._M_str = (char *)&local_338;
  input._M_len = (size_t)"rm { a: 11\n b: 12 }";
  TextFormat::MergeFromString((TextFormat *)&DAT_00000013,input,in_RCX);
  input_00._M_str = (char *)&local_280;
  input_00._M_len = (size_t)"rm { a: 11\n b: 13 }";
  TextFormat::MergeFromString((TextFormat *)&DAT_00000013,input_00,in_RCX);
  util::MessageDifferencer::MessageDifferencer(&local_1c8);
  paVar1 = &local_368.field_2;
  local_368._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_368,"rm","");
  field = GetFieldDescriptor((anon_unknown_0 *)&local_338,(Message *)local_368._M_dataplus._M_p,
                             (string *)local_368._M_string_length);
  util::MessageDifferencer::TreatAsSet(&local_1c8,field);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_368._M_dataplus._M_p != paVar1) {
    operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
  }
  this_00.
  super__Tuple_impl<0UL,_google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_std::default_delete<google::protobuf::util::MessageDifferencer::IgnoreCriteria>_>
  .super__Head_base<0UL,_google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_false>.
  _M_head_impl = (_Tuple_impl<0UL,_google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_std::default_delete<google::protobuf::util::MessageDifferencer::IgnoreCriteria>_>
                  )operator_new(8);
  *(_func_int ***)
   this_00.
   super__Tuple_impl<0UL,_google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_std::default_delete<google::protobuf::util::MessageDifferencer::IgnoreCriteria>_>
   .super__Head_base<0UL,_google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_false>.
   _M_head_impl = (_func_int **)0x0;
  util::MessageDifferencer::IgnoreCriteria::IgnoreCriteria
            ((IgnoreCriteria *)
             this_00.
             super__Tuple_impl<0UL,_google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_std::default_delete<google::protobuf::util::MessageDifferencer::IgnoreCriteria>_>
             .
             super__Head_base<0UL,_google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_false>
             ._M_head_impl);
  *(undefined ***)
   this_00.
   super__Tuple_impl<0UL,_google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_std::default_delete<google::protobuf::util::MessageDifferencer::IgnoreCriteria>_>
   .super__Head_base<0UL,_google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_false>.
   _M_head_impl = &PTR__IgnoreCriteria_018f2160;
  local_380._M_t.
  super__Tuple_impl<0UL,_google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_std::default_delete<google::protobuf::util::MessageDifferencer::IgnoreCriteria>_>
  .super__Head_base<0UL,_google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_false>.
  _M_head_impl = (tuple<google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_std::default_delete<google::protobuf::util::MessageDifferencer::IgnoreCriteria>_>
                  )(tuple<google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_std::default_delete<google::protobuf::util::MessageDifferencer::IgnoreCriteria>_>
                    )this_00.
                     super__Tuple_impl<0UL,_google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_std::default_delete<google::protobuf::util::MessageDifferencer::IgnoreCriteria>_>
                     .
                     super__Head_base<0UL,_google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_false>
                     ._M_head_impl;
  util::MessageDifferencer::AddIgnoreCriteria
            (&local_1c8,
             (unique_ptr<google::protobuf::util::MessageDifferencer::IgnoreCriteria,_std::default_delete<google::protobuf::util::MessageDifferencer::IgnoreCriteria>_>
              *)&local_380);
  if ((_Tuple_impl<0UL,_google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_std::default_delete<google::protobuf::util::MessageDifferencer::IgnoreCriteria>_>
       )local_380._M_t.
        super__Tuple_impl<0UL,_google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_std::default_delete<google::protobuf::util::MessageDifferencer::IgnoreCriteria>_>
        .super__Head_base<0UL,_google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_false>.
        _M_head_impl != (IgnoreCriteria *)0x0) {
    (*(*(_func_int ***)
        local_380._M_t.
        super__Tuple_impl<0UL,_google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_std::default_delete<google::protobuf::util::MessageDifferencer::IgnoreCriteria>_>
        .super__Head_base<0UL,_google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_false>.
        _M_head_impl)[1])();
  }
  local_380._M_t.
  super__Tuple_impl<0UL,_google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_std::default_delete<google::protobuf::util::MessageDifferencer::IgnoreCriteria>_>
  .super__Head_base<0UL,_google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_false>.
  _M_head_impl = (tuple<google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_std::default_delete<google::protobuf::util::MessageDifferencer::IgnoreCriteria>_>
                  )(_Tuple_impl<0UL,_google::protobuf::util::MessageDifferencer::IgnoreCriteria_*,_std::default_delete<google::protobuf::util::MessageDifferencer::IgnoreCriteria>_>
                    )0x0;
  local_348[0] = (internal)
                 util::MessageDifferencer::Compare
                           (&local_1c8,&local_338.super_Message,&local_280.super_Message);
  local_340 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_348[0]) {
    testing::Message::Message((Message *)&local_370);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_368,local_348,(AssertionResult *)"differ.Compare(msg1, msg2)","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_378,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/util/message_differencer_unittest.cc"
               ,0x960,local_368._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=(&local_378,(Message *)&local_370);
    testing::internal::AssertHelper::~AssertHelper(&local_378);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_368._M_dataplus._M_p != paVar1) {
      operator_delete(local_368._M_dataplus._M_p,local_368.field_2._M_allocated_capacity + 1);
    }
    if (local_370._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_370._M_head_impl + 8))();
    }
    if (local_340 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      std::
      default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)&local_340,local_340);
    }
  }
  util::MessageDifferencer::~MessageDifferencer(&local_1c8);
  proto2_unittest::TestDiffMessage::~TestDiffMessage(&local_280);
  proto2_unittest::TestDiffMessage::~TestDiffMessage(&local_338);
  return;
}

Assistant:

TEST(MessageDifferencerTest, TreatRepeatedFieldAsSetWithIgnoredFields) {
  proto2_unittest::TestDiffMessage msg1;
  proto2_unittest::TestDiffMessage msg2;
  TextFormat::MergeFromString("rm { a: 11\n b: 12 }", &msg1);
  TextFormat::MergeFromString("rm { a: 11\n b: 13 }", &msg2);
  util::MessageDifferencer differ;
  differ.TreatAsSet(GetFieldDescriptor(msg1, "rm"));
  differ.AddIgnoreCriteria(std::make_unique<TestIgnorer>());
  EXPECT_TRUE(differ.Compare(msg1, msg2));
}